

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall inject::no_binding::no_binding(no_binding *this,unique_id component)

{
  ostream *poVar1;
  stringstream oss;
  string asStack_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [376];
  
  *(undefined ***)this = &PTR__no_binding_0010fab0;
  this->_component = component;
  (this->_msg)._M_dataplus._M_p = (pointer)&(this->_msg).field_2;
  (this->_msg)._M_string_length = 0;
  (this->_msg).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"component ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1," has no binding");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->_msg,asStack_1b8);
  std::__cxx11::string::~string(asStack_1b8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

no_binding(unique_id component) throw() :
            exception(), _component(component) {
        std::stringstream oss;
        oss << "component " << component << " has no binding";
        _msg = oss.str();
    }